

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O2

void monster_list_sort(monster_list_t *list,_func_wchar_t_void_ptr_void_ptr *compare)

{
  ulong nmemb;
  
  if ((((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) &&
      (list->sorted == false)) && (nmemb = (ulong)list->distinct_entries, 1 < nmemb)) {
    if (list->entries_size < nmemb) {
      nmemb = list->entries_size;
    }
    sort(list->entries,nmemb,0x28,compare);
    list->sorted = true;
  }
  return;
}

Assistant:

void monster_list_sort(monster_list_t *list,
					   int (*compare)(const void *, const void *))
{
	size_t elements;

	if (list == NULL || list->entries == NULL)
		return;

	if (list->sorted)
		return;

	elements = list->distinct_entries;

	if (elements <= 1)
		return;

	sort(list->entries, MIN(elements, list->entries_size), sizeof(list->entries[0]), compare);
	list->sorted = true;
}